

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void get_remote_block_pos
               (Integer idx,Integer ndim,Integer *lo_loc,Integer *hi_loc,Integer *slo_rem,
               Integer *shi_rem,Integer *dims,Integer *width)

{
  long lVar1;
  Integer IVar2;
  long lVar3;
  Integer aIStack_88 [2];
  Integer hi_rem [7];
  Integer lo_rem [7];
  
  if (0 < ndim) {
    lVar3 = 0;
    do {
      if (idx == lVar3) {
        lVar1 = hi_loc[idx] + 1;
        IVar2 = hi_loc[idx] + width[idx];
      }
      else {
        lVar1 = lo_loc[lVar3];
        IVar2 = hi_loc[lVar3];
      }
      hi_rem[lVar3 + 6] = lVar1;
      aIStack_88[lVar3] = IVar2;
      lVar3 = lVar3 + 1;
    } while (ndim != lVar3);
    if (0 < ndim) {
      lVar3 = 0;
      do {
        if (idx == lVar3) {
          lVar1 = aIStack_88[idx];
          if (dims[idx] < lVar1) {
            slo_rem[idx] = 1;
            lVar1 = width[idx];
          }
          else {
            slo_rem[idx] = hi_rem[idx + 6];
          }
          shi_rem[idx] = lVar1;
        }
        else {
          slo_rem[lVar3] = hi_rem[lVar3 + 6];
          shi_rem[lVar3] = aIStack_88[lVar3];
        }
        lVar3 = lVar3 + 1;
      } while (ndim != lVar3);
    }
  }
  return;
}

Assistant:

static void get_remote_block_pos(Integer idx, Integer ndim, Integer *lo_loc,
                          Integer *hi_loc, Integer *slo_rem, Integer *shi_rem,
                          Integer *dims, Integer *width)
{
  Integer i, lo_rem[MAXDIM], hi_rem[MAXDIM];
  /* Start by getting rough idea of where data needs to go. */
  for (i = 0; i < ndim; i++) {
    if (i == idx) {
      lo_rem[i] = hi_loc[i] + 1;
      hi_rem[i] = hi_loc[i] + width[i];
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }

  /* Account for boundaries, if necessary. */
  for (i=0; i<ndim; i++) {
    if (i == idx) {
      if (hi_rem[i] > dims[i]) {
        slo_rem[i] = 1;
        shi_rem[i] = width[i];
      } else {
        slo_rem[i] = lo_rem[i];
        shi_rem[i] = hi_rem[i];
      }
    } else {
      slo_rem[i] = lo_rem[i];
      shi_rem[i] = hi_rem[i];
    }
  }
}